

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledCompression.cpp
# Opt level: O0

void anon_unknown.dwarf_1e5e41::fillPixels3
               (Array2D<unsigned_int> *pi,Array2D<half> *ph,Array2D<float> *pf,int width,int height)

{
  ostream *this;
  uint *puVar1;
  float *pfVar2;
  int in_ECX;
  int iVar3;
  uint uVar4;
  Array2D<float> *in_RDX;
  Array2D<half> *in_RSI;
  Array2D<unsigned_int> *in_RDI;
  int in_R8D;
  double dVar5;
  double dVar6;
  int x;
  int y;
  float in_stack_ffffffffffffffac;
  int local_28;
  int local_24;
  
  this = std::operator<<((ostream *)&std::cout,"pattern 2");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  for (local_24 = 0; local_24 < in_R8D; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < in_ECX; local_28 = local_28 + 1) {
      iVar3 = local_28 % 100;
      uVar4 = iVar3 + (local_24 % 100) * 100;
      puVar1 = Imf_2_5::Array2D<unsigned_int>::operator[](in_RDI,(long)local_24);
      puVar1[local_28] = uVar4;
      sin((double)local_28);
      sin((double)local_24 * 0.5);
      Imf_2_5::Array2D<half>::operator[](in_RSI,(long)local_24);
      half::operator=((half *)CONCAT44(uVar4,iVar3),in_stack_ffffffffffffffac);
      dVar5 = sin((double)local_24);
      dVar6 = sin((double)local_28 * 0.5);
      pfVar2 = Imf_2_5::Array2D<float>::operator[](in_RDX,(long)local_24);
      pfVar2[local_28] = (float)(dVar5 + dVar6);
    }
  }
  return;
}

Assistant:

void
fillPixels3 (Array2D<unsigned int> &pi,
	     Array2D<half> &ph,
	     Array2D<float> &pf,
	     int width,
	     int height)
{
    cout << "pattern 2" << endl;

    for (int y = 0; y < height; ++y)
	for (int x = 0; x < width; ++x)
	{
	    pi[y][x] = x % 100 + 100 * (y % 100);
	    ph[y][x] = sin (double (x)) + sin (y * 0.5);
	    pf[y][x] = sin (double (y)) + sin (x * 0.5);
	}
}